

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::IntStateGather
          (ChParticleCloud *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  pointer ppCVar1;
  uint uVar2;
  ulong uVar3;
  ChVector<double> local_90;
  ChVector<double> *local_78 [2];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppCVar1 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles).
                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar3)
    break;
    local_90.m_data[0] =
         (double)((long)&(ppCVar1[uVar3]->super_ChParticleBase).super_ChFrameMoving<double>.
                         super_ChFrame<double> + 8);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&x->super_ChVectorDynamic<double>,(ulong)off_x,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_90);
    local_90.m_data[0] =
         (double)((long)&((this->particles).
                          super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3]->super_ChParticleBase).
                         super_ChFrameMoving<double>.super_ChFrame<double> + 0x20);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&x->super_ChVectorDynamic<double>,(ulong)(off_x + 3),4);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_90);
    local_90.m_data[0] =
         (double)&((this->particles).
                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3]->super_ChParticleBase).
                  super_ChFrameMoving<double>.coord_dt;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&v->super_ChVectorDynamic<double>,(ulong)off_v,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_90);
    ChFrameMoving<double>::GetWvel_loc
              (&local_90,
               (ChFrameMoving<double> *)
               (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3]);
    local_78[0] = &local_90;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&v->super_ChVectorDynamic<double>,(ulong)(off_v + 3),3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
    off_v = off_v + 6;
    off_x = off_x + 7;
    *T = (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj.ChTime;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                       ChState& x,                // state vector, position part
                                       const unsigned int off_v,  // offset in v state vector
                                       ChStateDelta& v,           // state vector, speed part
                                       double& T                  // time
) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        x.segment(off_x + 7 * j + 0, 3) = particles[j]->coord.pos.eigen();
        x.segment(off_x + 7 * j + 3, 4) = particles[j]->coord.rot.eigen();

        v.segment(off_v + 6 * j + 0, 3) = particles[j]->coord_dt.pos.eigen();
        v.segment(off_v + 6 * j + 3, 3) = particles[j]->GetWvel_loc().eigen();

        T = GetChTime();
    }
}